

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void FBehavior::StaticSerializeModuleStates(FArchive *arc)

{
  char *__s2;
  FBehavior *this;
  char *pcVar1;
  int iVar2;
  int ModSize;
  char *modname;
  uint local_40;
  DWORD local_3c;
  char *local_38;
  
  local_3c = StaticModules.Count;
  FArchive::operator<<(arc,&local_3c);
  if (local_3c != StaticModules.Count) {
    I_Error("Level was saved with a different number of ACS modules. (Have %d, save has %d)");
  }
  local_3c = 0;
  if (StaticModules.Count != 0) {
    do {
      this = StaticModules.Array[local_3c];
      local_40 = this->DataSize;
      if (arc->m_Storing == true) {
        FArchive::WriteString(arc,this->ModuleName);
        FArchive::operator<<(arc,&local_40);
      }
      else {
        local_38 = (char *)0x0;
        FArchive::operator<<(arc,&local_38);
        FArchive::operator<<(arc,&local_40);
        pcVar1 = local_38;
        __s2 = this->ModuleName;
        iVar2 = strcasecmp(local_38,__s2);
        if (iVar2 == 0) {
          if (local_40 != this->DataSize) {
            if (pcVar1 != (char *)0x0) {
              operator_delete__(pcVar1);
            }
            I_Error("ACS module %s has changed from what was saved. (Have %d bytes, save has %d bytes)"
                    ,__s2,(ulong)(uint)this->DataSize,(ulong)local_40);
          }
        }
        else {
          if (pcVar1 != (char *)0x0) {
            operator_delete__(pcVar1);
          }
          I_Error("Level was saved with a different set or order of ACS modules. (Have %s, save has %s)"
                  ,__s2,local_38);
        }
        if (local_38 != (char *)0x0) {
          operator_delete__(local_38);
        }
      }
      SerializeVars(this,arc);
      local_3c = local_3c + 1;
    } while (local_3c < StaticModules.Count);
  }
  return;
}

Assistant:

void FBehavior::StaticSerializeModuleStates (FArchive &arc)
{
	DWORD modnum;

	modnum = StaticModules.Size();
	arc << modnum;

	if (modnum != StaticModules.Size())
	{
		I_Error("Level was saved with a different number of ACS modules. (Have %d, save has %d)", StaticModules.Size(), modnum);
	}

	for (modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		FBehavior *module = StaticModules[modnum];
		int ModSize = module->GetDataSize();

		if (arc.IsStoring())
		{
			arc.WriteString (module->ModuleName);
			arc << ModSize;
		}
		else
		{
			char *modname = NULL;
			arc << modname;
			arc << ModSize;
			if (stricmp (modname, module->ModuleName) != 0)
			{
				delete[] modname;
				I_Error("Level was saved with a different set or order of ACS modules. (Have %s, save has %s)", module->ModuleName, modname);
			}
			else if (ModSize != module->GetDataSize())
			{
				delete[] modname;
				I_Error("ACS module %s has changed from what was saved. (Have %d bytes, save has %d bytes)", module->ModuleName, module->GetDataSize(), ModSize);
			}
			delete[] modname;
		}
		module->SerializeVars (arc);
	}
}